

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

void __thiscall
InlineeFrameRecord::Restore
          (InlineeFrameRecord *this,FunctionBody *functionBody,InlinedFrameLayout *inlinedFrame,
          JavascriptCallStackLayout *layout,bool boxValues)

{
  code *pcVar1;
  anon_class_32_4_7a27e9c0 callback;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  int iVar5;
  undefined4 *puVar6;
  Var aValue;
  ScriptFunction *this_00;
  FunctionBody *pFVar7;
  undefined4 extraout_var;
  undefined7 uStack_47;
  ScriptFunction *function;
  Var varFunction;
  bool boxValues_local;
  JavascriptCallStackLayout *layout_local;
  InlinedFrameLayout *inlinedFrame_local;
  FunctionBody *functionBody_local;
  InlineeFrameRecord *this_local;
  
  if (this->inlineDepth == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd3,"(this->inlineDepth != 0)","this->inlineDepth != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->inlineeStartOffset == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd4,"(inlineeStartOffset != 0)","inlineeStartOffset != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((DAT_01ec73ca & 1) != 0) {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar3,LVar4);
    if (bVar2) {
      Output::Print(L"Restore function object: ");
    }
  }
  aValue = Restore(this,this->functionOffset,false,false,layout,functionBody,boxValues);
  bVar2 = Js::VarIs<Js::ScriptFunction>(aValue);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd9,"(Js::VarIs<Js::ScriptFunction>(varFunction))",
                       "Js::VarIs<Js::ScriptFunction>(varFunction)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  this_00 = Js::VarTo<Js::ScriptFunction>(aValue);
  if ((DAT_01ec73ca & 1) != 0) {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar3,LVar4);
    if (bVar2) {
      pFVar7 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      iVar5 = (*(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      pFVar7 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
      pFVar7 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
      Output::Print(L"Inlinee: %s [%d.%d] \n",CONCAT44(extraout_var,iVar5),(ulong)uVar3,(ulong)LVar4
                   );
    }
  }
  inlinedFrame->function = (JavascriptFunction *)this_00;
  (inlinedFrame->callInfo).InlineeStartOffset = this->inlineeStartOffset;
  *(uint *)&inlinedFrame->callInfo =
       *(uint *)&inlinedFrame->callInfo & 0xfffffff0 | this->argCount & 0xf;
  callback._25_7_ = uStack_47;
  callback.boxValues = boxValues;
  callback.functionBody = functionBody;
  callback.this = this;
  callback.layout = layout;
  InlinedFrameLayout::
  MapArgs<InlineeFrameRecord::Restore(Js::FunctionBody*,InlinedFrameLayout*,Js::JavascriptCallStackLayout*,bool)const::__0>
            (inlinedFrame,callback);
  inlinedFrame->arguments = (Var)0x0;
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,BailOutPhase,uVar3,LVar4);
  if (!bVar2) {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar3,LVar4);
    if (!bVar2) {
      return;
    }
  }
  Output::Flush();
  return;
}

Assistant:

void InlineeFrameRecord::Restore(Js::FunctionBody* functionBody, InlinedFrameLayout *inlinedFrame, Js::JavascriptCallStackLayout * layout, bool boxValues) const
{
    Assert(this->inlineDepth != 0);
    Assert(inlineeStartOffset != 0);

    BAILOUT_VERBOSE_TRACE(functionBody, _u("Restore function object: "));
    // No deepCopy needed for just the function
    Js::Var varFunction = this->Restore(this->functionOffset, /*isFloat64*/ false, /*isInt32*/ false, layout, functionBody, boxValues);
    Assert(Js::VarIs<Js::ScriptFunction>(varFunction));

    Js::ScriptFunction* function = Js::VarTo<Js::ScriptFunction>(varFunction);
    BAILOUT_VERBOSE_TRACE(functionBody, _u("Inlinee: %s [%d.%d] \n"), function->GetFunctionBody()->GetDisplayName(), function->GetFunctionBody()->GetSourceContextId(), function->GetFunctionBody()->GetLocalFunctionId());

    inlinedFrame->function = function;
    inlinedFrame->callInfo.InlineeStartOffset = inlineeStartOffset;
    inlinedFrame->callInfo.Count = this->argCount;
    inlinedFrame->MapArgs([=](uint i, Js::Var* varRef) {
        bool isFloat64 = floatArgs.Test(i) != 0;
        bool isInt32 = losslessInt32Args.Test(i) != 0;
        BAILOUT_VERBOSE_TRACE(functionBody, _u("Restore argument %d: "), i);

        // Forward deepCopy flag for the arguments in case their data must be guaranteed
        // to have its own lifetime
        Js::Var var = this->Restore(this->argOffsets[i], isFloat64, isInt32, layout, functionBody, boxValues);
#if DBG
        if (boxValues && !Js::TaggedNumber::Is(var))
        {
            Js::RecyclableObject *const recyclableObject = Js::VarTo<Js::RecyclableObject>(var);
            Assert(!ThreadContext::IsOnStack(recyclableObject));
        }
#endif
        *varRef = var;
    });
    inlinedFrame->arguments = nullptr;
    BAILOUT_FLUSH(functionBody);
}